

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int iVar4;
  uint uVar5;
  Aig_Obj_t *pObj_00;
  uint uVar6;
  uint uVar7;
  
  uVar1 = *(ulong *)&pObj->field_0x18;
  if (((uint)uVar1 & 7) == 3) {
    if ((uVar1 & 0x20) != 0) {
      return;
    }
    if (p->nTruePos <= (pObj->field_0).CioId) {
      return;
    }
  }
  else if ((uVar1 & 0x20) != 0) {
    return;
  }
  if ((uVar1 & 0x10) == 0) {
    if (((uint)uVar1 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                    ,0x405,
                    "void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)")
      ;
    }
    *(ulong *)&pObj->field_0x18 = uVar1 | 0x20;
    uVar7 = vCone->nSize;
    if (uVar7 == vCone->nCap) {
      if ((int)uVar7 < 0x10) {
        if (vCone->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vCone->pArray,0x80);
        }
        vCone->pArray = ppvVar3;
        vCone->nCap = 0x10;
      }
      else {
        if (vCone->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar7 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vCone->pArray,(ulong)uVar7 << 4);
        }
        vCone->pArray = ppvVar3;
        vCone->nCap = uVar7 * 2;
      }
    }
    else {
      ppvVar3 = vCone->pArray;
    }
    iVar4 = vCone->nSize;
    vCone->nSize = iVar4 + 1;
    ppvVar3[iVar4] = pObj;
  }
  if (p->pFanData != (int *)0x0) {
    if ((*(uint *)&pObj->field_0x18 & 0xffffffc0) != 0) {
      uVar6 = 0;
      uVar7 = 0xffffffff;
      do {
        if (uVar6 == 0) {
          if (p->nFansAlloc <= pObj->Id) {
            __assert_fail("ObjId < p->nFansAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
          }
          iVar4 = pObj->Id * 5;
        }
        else {
          if (p->nFansAlloc <= (int)uVar7 / 2) {
            __assert_fail("iFan/2 < p->nFansAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
          }
          iVar4 = ((int)uVar7 >> 1) * 5 + (uVar7 & 1) + 3;
        }
        pVVar2 = p->vObjs;
        uVar7 = p->pFanData[iVar4];
        if (pVVar2 == (Vec_Ptr_t *)0x0) {
          pObj_00 = (Aig_Obj_t *)0x0;
        }
        else {
          uVar5 = (int)uVar7 >> 1;
          if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pObj_00 = (Aig_Obj_t *)pVVar2->pArray[uVar5];
        }
        Llb_ManFlowCollectAndMarkCone_rec(p,pObj_00,vCone);
        uVar6 = uVar6 + 1;
      } while (uVar6 < *(uint *)&pObj->field_0x18 >> 6);
    }
    return;
  }
  __assert_fail("p->pFanData",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                ,0x40a,
                "void Llb_ManFlowCollectAndMarkCone_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Llb_ManFlowCollectAndMarkCone_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    Aig_Obj_t * pFanout;
    int i, iFanout = -1;
    if ( Saig_ObjIsLi(p, pObj) )
        return;
    if ( pObj->fMarkB )
        return;
    if ( pObj->fMarkA == 0 )
    {
        assert( Aig_ObjIsNode(pObj) );
        pObj->fMarkB = 1;
        if ( Aig_ObjIsNode(pObj) )
            Vec_PtrPush( vCone, pObj );
    }
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Llb_ManFlowCollectAndMarkCone_rec( p, pFanout, vCone );
}